

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::XMLURL::isRelative(XMLURL *this)

{
  XMLURL *this_local;
  
  if (this->fProtocol == Unknown) {
    this_local._7_1_ = true;
  }
  else if (this->fPath == (XMLCh *)0x0) {
    this_local._7_1_ = true;
  }
  else if (*this->fPath == L'/') {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool XMLURL::isRelative() const
{
    // If no protocol then relative
    if (fProtocol == Unknown)
        return true;

    // If no path, or the path is not absolute, then relative
    if (!fPath)
        return true;

    if (*fPath != chForwardSlash)
        return true;

    return false;
}